

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void __thiscall ImGuiInputTextState::OnKeyPressed(ImGuiInputTextState *this,int key)

{
  STB_TexteditState *state;
  int *piVar1;
  short *psVar2;
  ImWchar *pIVar3;
  float fVar4;
  short sVar5;
  ushort uVar6;
  undefined2 uVar7;
  undefined2 uVar8;
  undefined2 uVar9;
  undefined2 uVar10;
  unsigned_short *puVar11;
  float fVar12;
  StbUndoRecord *pSVar13;
  bool bVar14;
  int temp;
  int iVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  ImStb *pIVar19;
  int temp_1;
  int iVar20;
  long lVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  undefined8 in_R8;
  float fVar25;
  StbFindState find;
  uchar local_71;
  ImWchar *local_58;
  ImStb *local_50;
  ImWchar local_48 [6];
  int local_3c;
  int local_38;
  int local_34;
  
  state = &this->Stb;
  local_50 = (ImStb *)&(this->Stb).preferred_x;
  do {
    switch(key) {
    case 0x200000:
      iVar17 = (this->Stb).select_start;
      iVar20 = (this->Stb).select_end;
      if (iVar17 == iVar20) {
        if (0 < state->cursor) {
          state->cursor = state->cursor + -1;
        }
      }
      else {
        if (iVar20 < iVar17) {
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar20;
        }
        iVar17 = (this->Stb).select_start;
        (this->Stb).cursor = iVar17;
        (this->Stb).select_end = iVar17;
        (this->Stb).has_preferred_x = '\0';
      }
      goto LAB_00176b7f;
    case 0x200001:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        state->cursor = state->cursor + 1;
      }
      else {
        ImStb::stb_textedit_move_to_last(this,state);
      }
      ImStb::stb_textedit_clamp(this,state);
      goto LAB_00176b7f;
    case 0x200002:
switchD_0017627c_caseD_200002:
      local_71 = (this->Stb).single_line;
      if (local_71 == '\0') {
        iVar17 = (this->Stb).select_start;
        iVar20 = (this->Stb).select_end;
        if ((key & 0x400000U) == 0) {
          if (iVar17 != iVar20) {
            if (iVar20 < iVar17) {
              (this->Stb).select_end = iVar17;
              (this->Stb).select_start = iVar20;
            }
            iVar17 = (this->Stb).select_start;
            (this->Stb).cursor = iVar17;
            (this->Stb).select_end = iVar17;
            (this->Stb).has_preferred_x = '\0';
          }
        }
        else if (iVar17 == iVar20) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar20;
        }
        ImStb::stb_textedit_clamp(this,state);
        ImStb::stb_textedit_find_charpos
                  ((ImStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                   (uint)(this->Stb).single_line,(int)in_R8);
        iVar17 = local_34;
        if (local_34 != local_3c) {
          pIVar19 = local_50;
          if ((this->Stb).has_preferred_x == '\0') {
            pIVar19 = (ImStb *)local_48;
          }
          fVar4 = *(float *)pIVar19;
          (this->Stb).cursor = local_34;
          puVar11 = (this->TextW).Data;
          local_58 = (ImWchar *)0x0;
          pIVar3 = puVar11 + local_34;
          InputTextCalcTextSizeW
                    (pIVar3,puVar11 + this->CurLenW,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
          iVar20 = (int)((ulong)((long)local_58 - (long)pIVar3) >> 1);
          if (0 < iVar20) {
            fVar12 = 0.0;
            iVar15 = 1;
            do {
              fVar25 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar17,iVar15 + -1);
              if (((fVar25 == -1.0) && (!NAN(fVar25))) || (fVar12 = fVar12 + fVar25, fVar4 < fVar12)
                 ) {
                bVar14 = false;
              }
              else {
                state->cursor = state->cursor + 1;
                bVar14 = true;
              }
            } while ((bVar14) && (bVar14 = iVar15 < iVar20, iVar15 = iVar15 + 1, bVar14));
          }
          goto LAB_0017652b;
        }
      }
      else {
        key = key & 0x400000U | 0x200000;
      }
      break;
    case 0x200003:
switchD_0017627c_caseD_200003:
      local_71 = (this->Stb).single_line;
      if (local_71 == '\0') {
        iVar17 = (this->Stb).select_start;
        iVar20 = (this->Stb).select_end;
        if ((key & 0x400000U) == 0) {
          if (iVar17 != iVar20) {
            ImStb::stb_textedit_move_to_last(this,state);
          }
        }
        else if (iVar17 == iVar20) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar20;
        }
        ImStb::stb_textedit_clamp(this,state);
        ImStb::stb_textedit_find_charpos
                  ((ImStb *)local_48,(StbFindState *)this,
                   (ImGuiInputTextState *)(ulong)(uint)(this->Stb).cursor,
                   (uint)(this->Stb).single_line,(int)in_R8);
        if ((long)local_38 == 0) break;
        pIVar19 = local_50;
        if ((this->Stb).has_preferred_x == '\0') {
          pIVar19 = (ImStb *)local_48;
        }
        fVar4 = *(float *)pIVar19;
        lVar21 = (long)local_3c + (long)local_38;
        iVar17 = (int)lVar21;
        (this->Stb).cursor = iVar17;
        puVar11 = (this->TextW).Data;
        local_58 = (ImWchar *)0x0;
        pIVar3 = puVar11 + lVar21;
        InputTextCalcTextSizeW
                  (pIVar3,puVar11 + this->CurLenW,&local_58,(ImVec2 *)0x1,SUB81(in_R8,0));
        iVar20 = (int)((ulong)((long)local_58 - (long)pIVar3) >> 1);
        if (0 < iVar20) {
          fVar12 = 0.0;
          iVar15 = 1;
          do {
            fVar25 = ImStb::STB_TEXTEDIT_GETWIDTH(this,iVar17,iVar15 + -1);
            if (((fVar25 == -1.0) && (!NAN(fVar25))) || (fVar12 = fVar12 + fVar25, fVar4 < fVar12))
            {
              bVar14 = false;
            }
            else {
              state->cursor = state->cursor + 1;
              bVar14 = true;
            }
          } while ((bVar14) && (bVar14 = iVar15 < iVar20, iVar15 = iVar15 + 1, bVar14));
        }
LAB_0017652b:
        ImStb::stb_textedit_clamp(this,state);
        (this->Stb).has_preferred_x = '\x01';
        (this->Stb).preferred_x = fVar4;
        if ((key & 0x400000U) != 0) {
          (this->Stb).select_end = (this->Stb).cursor;
        }
      }
      else {
        key = key & 0x400000U | 0x200001;
      }
      break;
    case 0x200004:
      ImStb::stb_textedit_clamp(this,state);
      iVar17 = (this->Stb).select_start;
      iVar20 = (this->Stb).select_end;
      if (iVar17 != iVar20) {
        if (iVar20 < iVar17) {
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar20;
        }
        iVar17 = (this->Stb).select_start;
        (this->Stb).cursor = iVar17;
        (this->Stb).select_end = iVar17;
        (this->Stb).has_preferred_x = '\0';
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = 0;
        goto LAB_00176b7f;
      }
      iVar17 = state->cursor;
      if ((long)iVar17 < 1) goto LAB_00176b7f;
      if ((this->TextW).Size < iVar17) goto LAB_00176ee8;
      puVar11 = (this->TextW).Data;
      lVar21 = (long)iVar17;
      goto LAB_00176bb9;
    case 0x200005:
      iVar17 = this->CurLenW;
      ImStb::stb_textedit_clamp(this,state);
      iVar20 = (this->Stb).select_start;
      iVar15 = (this->Stb).select_end;
      if (iVar20 != iVar15) {
        if (iVar15 < iVar20) {
          (this->Stb).select_end = iVar20;
          (this->Stb).select_start = iVar15;
        }
        iVar20 = (this->Stb).select_start;
        (this->Stb).cursor = iVar20;
        (this->Stb).select_end = iVar20;
        (this->Stb).has_preferred_x = '\0';
      }
      if ((this->Stb).single_line != '\0') {
        state->cursor = iVar17;
        goto LAB_00176b7f;
      }
      iVar20 = state->cursor;
      if (iVar17 <= iVar20) goto LAB_00176b7f;
      iVar15 = (this->TextW).Size;
      if (iVar15 <= iVar20) {
        iVar15 = iVar20;
      }
      puVar11 = (this->TextW).Data;
      lVar21 = 0;
      goto LAB_00176c00;
    case 0x200006:
      (this->Stb).select_end = 0;
      (this->Stb).cursor = 0;
      (this->Stb).select_start = 0;
      goto LAB_00176b7f;
    case 0x200007:
      (this->Stb).cursor = this->CurLenW;
      (this->Stb).select_start = 0;
      (this->Stb).select_end = 0;
      goto LAB_00176b7f;
    case 0x200008:
switchD_0017627c_caseD_200008:
      if ((this->Stb).select_start != (this->Stb).select_end) goto LAB_001765e3;
      iVar17 = (this->Stb).cursor;
      if (iVar17 < this->CurLenW) {
        ImStb::stb_textedit_delete(this,state,iVar17,1);
      }
      goto LAB_00176b7f;
    case 0x200009:
switchD_0017627c_caseD_200009:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        ImStb::stb_textedit_clamp(this,state);
        iVar17 = (this->Stb).cursor;
        if (0 < iVar17) {
          ImStb::stb_textedit_delete(this,state,iVar17 + -1,1);
          (this->Stb).cursor = (this->Stb).cursor + -1;
        }
      }
      else {
LAB_001765e3:
        ImStb::stb_textedit_delete_selection(this,state);
      }
      goto LAB_00176b7f;
    case 0x20000a:
      lVar21 = (long)(this->Stb).undostate.undo_point;
      if (lVar21 == 0) goto LAB_00176b7f;
      iVar17 = (this->Stb).undostate.undo_rec[lVar21 + -1].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar21 + -1].insert_length;
      uVar16 = (this->Stb).undostate.undo_rec[lVar21 + -1].delete_length;
      sVar5 = (this->Stb).undostate.redo_point;
      uVar24 = (ulong)sVar5;
      iVar15 = (this->Stb).undostate.undo_rec[lVar21 + -1].char_storage;
      (this->Stb).undostate.undo_rec[uVar24 - 1].char_storage = -1;
      (this->Stb).undostate.undo_rec[uVar24 - 1].insert_length = uVar16;
      (this->Stb).undostate.undo_rec[uVar24 - 1].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[uVar24 - 1].where = iVar17;
      if ((ulong)uVar16 == 0) goto LAB_00176ea3;
      iVar23 = (this->Stb).undostate.undo_char_point + uVar16;
      if (0x3e6 < iVar23) {
        (this->Stb).undostate.undo_rec[uVar24 - 1].insert_length = 0;
        goto LAB_00176e90;
      }
      iVar18 = (this->Stb).undostate.redo_char_point;
      bVar14 = iVar18 < iVar23;
      if (iVar23 <= iVar18) goto LAB_00176e20;
      if (sVar5 == 99) goto LAB_00176b7f;
      local_50 = (ImStb *)&(this->Stb).undostate.undo_rec[0].char_storage;
      goto LAB_00176ca4;
    case 0x20000b:
      lVar21 = (long)(this->Stb).undostate.redo_point;
      if (lVar21 == 99) goto LAB_00176b7f;
      sVar5 = (this->Stb).undostate.undo_point;
      iVar17 = (this->Stb).undostate.undo_rec[lVar21].where;
      iVar20 = (this->Stb).undostate.undo_rec[lVar21].insert_length;
      uVar16 = (this->Stb).undostate.undo_rec[lVar21].delete_length;
      iVar15 = (this->Stb).undostate.undo_rec[lVar21].char_storage;
      (this->Stb).undostate.undo_rec[sVar5].delete_length = iVar20;
      (this->Stb).undostate.undo_rec[sVar5].insert_length = uVar16;
      (this->Stb).undostate.undo_rec[sVar5].where = iVar17;
      (this->Stb).undostate.undo_rec[sVar5].char_storage = -1;
      if ((ulong)uVar16 == 0) goto LAB_00176ddb;
      iVar23 = (this->Stb).undostate.undo_char_point;
      if ((this->Stb).undostate.redo_char_point < (int)(iVar23 + uVar16)) {
        pSVar13 = (this->Stb).undostate.undo_rec + sVar5;
        pSVar13->insert_length = 0;
        pSVar13->delete_length = 0;
        goto LAB_00176dd0;
      }
      (this->Stb).undostate.undo_rec[sVar5].char_storage = iVar23;
      (this->Stb).undostate.undo_char_point = iVar23 + uVar16;
      if ((int)uVar16 < 1) goto LAB_00176dd0;
      iVar18 = (this->TextW).Size;
      if (iVar18 < iVar17) {
        iVar18 = iVar17;
      }
      puVar11 = (this->TextW).Data;
      uVar24 = 0;
      goto LAB_00176db5;
    case 0x20000c:
      iVar17 = (this->Stb).select_start;
      iVar20 = (this->Stb).select_end;
      if (iVar17 == iVar20) {
        iVar17 = state->cursor;
        goto LAB_00176749;
      }
      if (iVar20 < iVar17) {
        (this->Stb).select_end = iVar17;
        (this->Stb).select_start = iVar20;
      }
      iVar17 = (this->Stb).select_start;
      (this->Stb).cursor = iVar17;
      goto LAB_00176b7c;
    case 0x20000d:
      if ((this->Stb).select_start == (this->Stb).select_end) {
        iVar17 = this->CurLenW;
        iVar20 = (this->Stb).cursor;
        goto LAB_001767ba;
      }
      ImStb::stb_textedit_move_to_last(this,state);
      goto LAB_00176b83;
    default:
      switch(key) {
      case 0x600000:
        ImStb::stb_textedit_clamp(this,state);
        iVar17 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar17) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar17;
        }
        iVar17 = (this->Stb).select_end;
        if (0 < iVar17) {
          (this->Stb).select_end = iVar17 + -1;
        }
        break;
      case 0x600001:
        iVar17 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar17) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar17;
        }
        piVar1 = &(this->Stb).select_end;
        *piVar1 = *piVar1 + 1;
        ImStb::stb_textedit_clamp(this,state);
        break;
      case 0x600002:
        goto switchD_0017627c_caseD_200002;
      case 0x600003:
        goto switchD_0017627c_caseD_200003;
      case 0x600004:
        ImStb::stb_textedit_clamp(this,state);
        iVar17 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar17) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar17;
        }
        if ((this->Stb).single_line != '\0') {
          state->cursor = 0;
          goto LAB_00176b79;
        }
        iVar17 = state->cursor;
        if ((long)iVar17 < 1) goto LAB_00176b79;
        if ((this->TextW).Size < iVar17) goto LAB_00176ee8;
        puVar11 = (this->TextW).Data;
        lVar21 = (long)iVar17;
        goto LAB_00176b13;
      case 0x600005:
        iVar17 = this->CurLenW;
        ImStb::stb_textedit_clamp(this,state);
        iVar20 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar20) {
          iVar20 = (this->Stb).cursor;
          (this->Stb).select_end = iVar20;
          (this->Stb).select_start = iVar20;
        }
        else {
          state->cursor = iVar20;
        }
        if ((this->Stb).single_line != '\0') {
          state->cursor = iVar17;
          goto LAB_00176b79;
        }
        iVar20 = state->cursor;
        if (iVar17 <= iVar20) goto LAB_00176b79;
        iVar15 = (this->TextW).Size;
        if (iVar15 <= iVar20) {
          iVar15 = iVar20;
        }
        puVar11 = (this->TextW).Data;
        lVar21 = 0;
        goto LAB_00176b5a;
      case 0x600006:
        iVar17 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar17) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar17;
        }
        iVar17 = 0;
        goto LAB_00176a83;
      case 0x600007:
        iVar17 = (this->Stb).select_end;
        if ((this->Stb).select_start == iVar17) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        else {
          state->cursor = iVar17;
        }
        iVar17 = this->CurLenW;
LAB_00176a83:
        (this->Stb).select_end = iVar17;
        goto LAB_00176a86;
      case 0x600008:
        goto switchD_0017627c_caseD_200008;
      case 0x600009:
        goto switchD_0017627c_caseD_200009;
      default:
        uVar16 = 0;
        if (key < 0x200000) {
          uVar16 = key;
        }
        if (((int)uVar16 < 1) ||
           ((local_48[0] = (ImWchar)uVar16, uVar16 == 10 && ((this->Stb).single_line != '\0'))))
        goto LAB_00176b83;
        if (((this->Stb).insert_mode == '\0') ||
           (((this->Stb).select_start != (this->Stb).select_end ||
            (iVar17 = (this->Stb).cursor, this->CurLenW <= iVar17)))) {
          ImStb::stb_textedit_delete_selection(this,state);
          bVar14 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
          if (!bVar14) goto LAB_00176b83;
          ImStb::stb_text_createundo(&(this->Stb).undostate,(this->Stb).cursor,0,1);
        }
        else {
          ImStb::stb_text_makeundo_replace(this,state,iVar17,1,1);
          ImStb::STB_TEXTEDIT_DELETECHARS(this,(this->Stb).cursor,1);
          bVar14 = ImStb::STB_TEXTEDIT_INSERTCHARS(this,(this->Stb).cursor,local_48,1);
          if (!bVar14) goto LAB_00176b83;
        }
        (this->Stb).cursor = (this->Stb).cursor + 1;
        goto LAB_00176b7f;
      case 0x60000c:
        if ((this->Stb).select_start == (this->Stb).select_end) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        iVar17 = state->cursor;
        goto LAB_00176686;
      case 0x60000d:
        if ((this->Stb).select_start == (this->Stb).select_end) {
          iVar17 = (this->Stb).cursor;
          (this->Stb).select_end = iVar17;
          (this->Stb).select_start = iVar17;
        }
        iVar17 = this->CurLenW;
        iVar20 = (this->Stb).cursor;
        goto LAB_001766e2;
      }
      iVar17 = (this->Stb).select_end;
LAB_00176a86:
      (this->Stb).cursor = iVar17;
      goto LAB_00176b7f;
    }
  } while (local_71 != '\0');
  goto LAB_00176b83;
  while (iVar15 = ImStb::is_word_boundary_from_right(this,iVar20), iVar15 == 0) {
LAB_001766e2:
    iVar20 = iVar20 + 1;
    if (iVar17 <= iVar20) break;
  }
  if (iVar20 < iVar17) {
    iVar17 = iVar20;
  }
  (this->Stb).cursor = iVar17;
  (this->Stb).select_end = iVar17;
  goto LAB_001767de;
  while (iVar15 = ImStb::is_word_boundary_from_right(this,iVar20), iVar17 = iVar20, iVar15 == 0) {
LAB_00176686:
    iVar20 = iVar17 + -1;
    if (iVar17 < 1) break;
  }
  iVar17 = 0;
  if (0 < iVar20) {
    iVar17 = iVar20;
  }
  (this->Stb).cursor = iVar17;
  (this->Stb).select_end = iVar17;
  goto LAB_001767de;
  while( true ) {
    state->cursor = iVar20 + 1 + (int)lVar21;
    lVar21 = lVar21 + 1;
    if (iVar17 - iVar20 == (int)lVar21) break;
LAB_00176b5a:
    if ((long)iVar15 - (long)iVar20 == lVar21) goto LAB_00176ee8;
    if (puVar11[iVar20 + lVar21] == 10) break;
  }
  goto LAB_00176b79;
  while( true ) {
    state->cursor = (int)lVar21 + -1;
    bVar14 = lVar21 < 2;
    lVar21 = lVar21 + -1;
    if (bVar14) break;
LAB_00176b13:
    if (puVar11[lVar21 + -1] == 10) break;
  }
LAB_00176b79:
  iVar17 = (this->Stb).cursor;
LAB_00176b7c:
  (this->Stb).select_end = iVar17;
  goto LAB_00176b7f;
  while (iVar15 = ImStb::is_word_boundary_from_right(this,iVar20), iVar15 == 0) {
LAB_001767ba:
    iVar20 = iVar20 + 1;
    if (iVar17 <= iVar20) break;
  }
  if (iVar20 < iVar17) {
    iVar17 = iVar20;
  }
  (this->Stb).cursor = iVar17;
  goto LAB_001767de;
  while (iVar15 = ImStb::is_word_boundary_from_right(this,iVar20), iVar17 = iVar20, iVar15 == 0) {
LAB_00176749:
    iVar20 = iVar17 + -1;
    if (iVar17 < 1) break;
  }
  iVar17 = 0;
  if (0 < iVar20) {
    iVar17 = iVar20;
  }
  (this->Stb).cursor = iVar17;
LAB_001767de:
  ImStb::stb_textedit_clamp(this,state);
  goto LAB_00176b83;
  while( true ) {
    (this->Stb).undostate.undo_char[(long)iVar23 + uVar24] = puVar11[(long)iVar17 + uVar24];
    uVar24 = uVar24 + 1;
    if (uVar16 == uVar24) break;
LAB_00176db5:
    if ((uint)(iVar18 - iVar17) == uVar24) goto LAB_00176ee8;
  }
LAB_00176dd0:
  ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar17,uVar16);
LAB_00176ddb:
  if (iVar20 != 0) {
    ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar17,(this->Stb).undostate.undo_char + iVar15,iVar20);
    piVar1 = &(this->Stb).undostate.redo_char_point;
    *piVar1 = *piVar1 + iVar20;
  }
  (this->Stb).cursor = iVar20 + iVar17;
  uVar7 = (this->Stb).undostate.undo_point;
  uVar9 = (this->Stb).undostate.redo_point;
  (this->Stb).undostate.undo_point = uVar7 + 1;
  (this->Stb).undostate.redo_point = uVar9 + 1;
  goto LAB_00176b7f;
  while (uVar6 = (this->Stb).undostate.redo_point, uVar24 = (ulong)uVar6, uVar6 != 99) {
LAB_00176ca4:
    if ((short)uVar24 < 99) {
      if (-1 < (this->Stb).undostate.undo_rec[0x62].char_storage) {
        iVar23 = (this->Stb).undostate.undo_rec[0x62].insert_length;
        lVar21 = (long)(this->Stb).undostate.redo_char_point + (long)iVar23;
        iVar18 = (int)lVar21;
        (this->Stb).undostate.redo_char_point = iVar18;
        pIVar3 = (this->Stb).undostate.undo_char + lVar21;
        memmove(pIVar3,pIVar3 + -(long)iVar23,(long)(999 - iVar18) * 2);
        lVar21 = (long)(this->Stb).undostate.redo_point;
        if (lVar21 < 0x62) {
          lVar22 = lVar21 + -0x62;
          pIVar19 = local_50 + lVar21 * 0x10;
          do {
            if (-1 < *(int *)pIVar19) {
              *(int *)pIVar19 = *(int *)pIVar19 + iVar23;
            }
            pIVar19 = pIVar19 + 0x10;
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0);
        }
      }
      lVar21 = (long)(this->Stb).undostate.redo_point;
      if (lVar21 < 0) {
        __assert_fail("((char*)(state->undo_rec + state->redo_point)) >= buf_begin",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imstb_textedit.h"
                      ,0x475,"void ImStb::stb_textedit_discard_redo(StbUndoState *)");
      }
      memmove((this->Stb).undostate.undo_rec + lVar21 + 1,(this->Stb).undostate.undo_rec + lVar21,
              lVar21 * -0x10 + 0x620);
      psVar2 = &(this->Stb).undostate.redo_point;
      *psVar2 = *psVar2 + 1;
    }
    iVar23 = (this->Stb).undostate.undo_char_point + uVar16;
    iVar18 = (this->Stb).undostate.redo_char_point;
    bVar14 = iVar18 < iVar23;
    if (iVar23 <= iVar18) goto LAB_00176e20;
  }
  goto LAB_00176b7f;
LAB_00176e20:
  (this->Stb).undostate.undo_rec[(long)(this->Stb).undostate.redo_point + -1].char_storage =
       iVar18 - uVar16;
  (this->Stb).undostate.redo_char_point = iVar18 - uVar16;
  if (0 < (int)uVar16) {
    iVar23 = (this->TextW).Size;
    if (iVar23 < iVar17) {
      iVar23 = iVar17;
    }
    puVar11 = (this->TextW).Data;
    uVar24 = 0;
    do {
      if ((uint)(iVar23 - iVar17) == uVar24) goto LAB_00176ee8;
      *(unsigned_short *)
       ((long)this + uVar24 * 2 + (long)iVar18 * 2 + (long)(int)uVar16 * -2 + 0x694) =
           puVar11[(long)iVar17 + uVar24];
      uVar24 = uVar24 + 1;
    } while (uVar16 != uVar24);
  }
  if (!bVar14) {
LAB_00176e90:
    ImStb::STB_TEXTEDIT_DELETECHARS(this,iVar17,uVar16);
LAB_00176ea3:
    if (iVar20 != 0) {
      ImStb::STB_TEXTEDIT_INSERTCHARS(this,iVar17,(this->Stb).undostate.undo_char + iVar15,iVar20);
      piVar1 = &(this->Stb).undostate.undo_char_point;
      *piVar1 = *piVar1 - iVar20;
    }
    (this->Stb).cursor = iVar20 + iVar17;
    uVar8 = (this->Stb).undostate.undo_point;
    uVar10 = (this->Stb).undostate.redo_point;
    (this->Stb).undostate.undo_point = uVar8 + -1;
    (this->Stb).undostate.redo_point = uVar10 + -1;
  }
  goto LAB_00176b7f;
  while( true ) {
    state->cursor = iVar20 + 1 + (int)lVar21;
    lVar21 = lVar21 + 1;
    if (iVar17 - iVar20 == (int)lVar21) break;
LAB_00176c00:
    if ((long)iVar15 - (long)iVar20 == lVar21) {
LAB_00176ee8:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                    ,0x52f,
                    "const T &ImVector<unsigned short>::operator[](int) const [T = unsigned short]")
      ;
    }
    if (puVar11[iVar20 + lVar21] == 10) break;
  }
  goto LAB_00176b7f;
  while( true ) {
    state->cursor = (int)lVar21 + -1;
    bVar14 = lVar21 < 2;
    lVar21 = lVar21 + -1;
    if (bVar14) break;
LAB_00176bb9:
    if (puVar11[lVar21 + -1] == 10) break;
  }
LAB_00176b7f:
  (this->Stb).has_preferred_x = '\0';
LAB_00176b83:
  this->CursorFollow = true;
  this->CursorAnim = -0.3;
  return;
}

Assistant:

void ImGuiInputTextState::OnKeyPressed(int key)
{
    stb_textedit_key(this, &Stb, key);
    CursorFollow = true;
    CursorAnimReset();
}